

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAxyzDD.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChNodeFEAxyzDD::NodeIntStateScatterAcceleration
          (ChNodeFEAxyzDD *this,uint off_a,ChStateDelta *a)

{
  ChVector<double> local_b8;
  ChVector<double> local_98;
  ChVector<double> local_78;
  MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
  local_60 [56];
  
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_60,
             &a->super_ChVectorDynamic<double>,(ulong)off_a,3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_78,local_60,(type *)0x0);
  if ((ChVector<double> *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x50 != &local_78) {
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x50 = local_78.m_data[0];
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x58 = local_78.m_data[1];
    *(double *)&(this->super_ChNodeFEAxyzD).super_ChNodeFEAxyz.field_0x60 = local_78.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_60,
             &a->super_ChVectorDynamic<double>,(ulong)(off_a + 3),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_98,local_60,(type *)0x0);
  if (&(this->super_ChNodeFEAxyzD).D_dtdt != &local_98) {
    (this->super_ChNodeFEAxyzD).D_dtdt.m_data[0] = local_98.m_data[0];
    (this->super_ChNodeFEAxyzD).D_dtdt.m_data[1] = local_98.m_data[1];
    (this->super_ChNodeFEAxyzD).D_dtdt.m_data[2] = local_98.m_data[2];
  }
  Eigen::VectorBlock<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1>::VectorBlock
            ((VectorBlock<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1> *)local_60,
             &a->super_ChVectorDynamic<double>,(ulong)(off_a + 6),3);
  ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
            (&local_b8,local_60,(type *)0x0);
  if (&this->DD_dtdt != &local_b8) {
    (this->DD_dtdt).m_data[0] = local_b8.m_data[0];
    (this->DD_dtdt).m_data[1] = local_b8.m_data[1];
    (this->DD_dtdt).m_data[2] = local_b8.m_data[2];
  }
  return;
}

Assistant:

void ChNodeFEAxyzDD::NodeIntStateScatterAcceleration(const unsigned int off_a, const ChStateDelta& a) {
    SetPos_dtdt(a.segment(off_a, 3));
    SetD_dtdt(a.segment(off_a + 3, 3));
    SetDD_dtdt(a.segment(off_a + 6, 3));
}